

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbo.cpp
# Opt level: O1

void __thiscall vera::Vbo::printInfo(Vbo *this)

{
  long *plVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Vertices  = ",0xc);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->m_nVertices);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Indices   = ",0xc);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->m_nIndices);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  if (this->m_vertexLayout != (VertexLayout *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Vertex Layout:",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    VertexLayout::printAttrib(this->m_vertexLayout);
    return;
  }
  return;
}

Assistant:

void Vbo::printInfo() {
    std::cout << "Vertices  = " << m_nVertices << std::endl;
    std::cout << "Indices   = " << m_nIndices << std::endl;
    if (m_vertexLayout) {
        std::cout << "Vertex Layout:" << std::endl;
        m_vertexLayout->printAttrib();
    }
}